

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O1

char * libj1939_ifnam(int ifindex)

{
  uint uVar1;
  if_nameindex *piVar2;
  if_nameindex *piVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined2 *puVar6;
  
  while( true ) {
    piVar3 = saved;
    if ((saved == (if_nameindex *)0x0) &&
       (saved = (if_nameindex *)if_nameindex(), saved == (if_nameindex *)0x0)) {
      uVar5 = 0x105352;
      puVar6 = (undefined2 *)0x1;
      pcVar4 = (char *)err();
      *puVar6 = 0x1d;
      *(undefined1 *)(puVar6 + 10) = 0xff;
      *(undefined8 *)(puVar6 + 4) = 0;
      *(undefined4 *)(puVar6 + 8) = uVar5;
      return pcVar4;
    }
    uVar1 = saved->if_index;
    piVar2 = saved;
    while (uVar1 != 0) {
      if (uVar1 == ifindex) {
        return piVar2->if_name;
      }
      uVar1 = piVar2[1].if_index;
      piVar2 = piVar2 + 1;
    }
    if (piVar3 == (if_nameindex *)0x0) break;
    if_freenameindex((if_nameindex *)saved);
    saved = (if_nameindex *)0x0;
  }
  return (char *)0x0;
}

Assistant:

static const char *libj1939_ifnam(int ifindex)
{
	const struct if_nameindex *lp, *cached = saved;

	fetch_names();

	for (lp = saved; lp->if_index; ++lp) {
		if (lp->if_index == (unsigned int)ifindex)
			return lp->if_name;
	}
	if (cached) {
		/*
		 * the list was not recent
		 * iterate twice, but force a refresh now
		 * recursion stops since the 'saved' pointer is cleaned
		 */
		libj1939_cleanup();
		return libj1939_ifnam(ifindex);
	}
	return NULL;
}